

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse_assign_statement(Parser *this)

{
  pointer pTVar1;
  AbstractSyntaxNode *pAVar2;
  int iVar3;
  stringstream buffer;
  Type local_2fc;
  Token local_2f8;
  Token local_2a0;
  Token local_248;
  Token local_1f0;
  Type local_198 [32];
  ios_base local_118 [264];
  
  local_198[0] = kAssignStatement;
  pAVar2 = AbstractSyntaxNode::add_child
                     (this->current_,local_198,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar2;
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  iVar3 = this->index_ % this->total_;
  pTVar1 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1[iVar3].type_ == kIdentity) {
    if (pTVar1[(this->index_ + 1) % this->total_].type_ == kLeftBracket) {
      local_2fc = kIdentityArray;
      pAVar2 = AbstractSyntaxNode::add_child(this->current_,&local_2fc,pTVar1 + iVar3);
      this->current_ = pAVar2;
      AbstractSyntaxNode::add_child
                (pAVar2,(this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl
                        .super__Vector_impl_data._M_start + this->index_ % this->total_);
      local_2fc = kIdentity;
      match(&local_1f0,this,&local_2fc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1f0.extra_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.content_._M_dataplus._M_p != &local_1f0.content_.field_2) {
        operator_delete(local_1f0.content_._M_dataplus._M_p);
      }
      if ((this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
          super__Vector_impl_data._M_start[this->index_ % this->total_].type_ == kLeftBracket) {
        parse_array(this);
      }
    }
    else {
      local_2fc = kIdentity;
      pAVar2 = AbstractSyntaxNode::add_child(this->current_,&local_2fc,pTVar1 + iVar3);
      this->current_ = pAVar2;
      AbstractSyntaxNode::add_child
                (pAVar2,(this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl
                        .super__Vector_impl_data._M_start + this->index_ % this->total_);
      local_2fc = kIdentity;
      match(&local_248,this,&local_2fc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248.extra_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.content_._M_dataplus._M_p != &local_248.content_.field_2) {
        operator_delete(local_248.content_._M_dataplus._M_p);
      }
    }
    this->current_ = this->current_->parent_;
  }
  local_2fc = kAssign;
  match(&local_2a0,this,&local_2fc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a0.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.content_._M_dataplus._M_p != &local_2a0.content_.field_2) {
    operator_delete(local_2a0.content_._M_dataplus._M_p);
  }
  parse_expression(this);
  local_2fc = kSemicolon;
  match(&local_2f8,this,&local_2fc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f8.extra_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.content_._M_dataplus._M_p != &local_2f8.content_.field_2) {
    operator_delete(local_2f8.content_._M_dataplus._M_p);
  }
  this->current_ = this->current_->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void Parser::parse_assign_statement() {
    current_ = current_->add_child(Token::Type::kAssignStatement, forward_token());
    std::stringstream buffer;

    if (forward_token().type() == Token::Type::kIdentity && forward_token(2).type() == Token::Type::kLeftBracket) {
        current_ = current_->add_child(Token::Type::kIdentityArray, forward_token());
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
        if (forward_token().type() == Token::Type::kLeftBracket) {
            parse_array();
        }
        current_ = current_->parent();
    } else if (forward_token().type() == Token::Type::kIdentity) {
        current_ = current_->add_child(Token::Type::kIdentity, forward_token());
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
        current_ = current_->parent();
    }

    match(Token::Type::kAssign);
    parse_expression();
    match(Token::Type::kSemicolon);

    current_ = current_->parent();
}